

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O3

void init_simd(void)

{
  uint uVar1;
  char *pcVar2;
  
  if (simd_support != 0xffffffff) {
    return;
  }
  uVar1 = jpeg_simd_cpu_support();
  simd_support = uVar1;
  pcVar2 = getenv("JSIMD_FORCESSE2");
  if (((pcVar2 != (char *)0x0) && (*pcVar2 == '1')) && (pcVar2[1] == '\0')) {
    uVar1 = uVar1 & 8;
    simd_support = uVar1;
  }
  pcVar2 = getenv("JSIMD_FORCEAVX2");
  if (((pcVar2 != (char *)0x0) && (*pcVar2 == '1')) && (pcVar2[1] == '\0')) {
    simd_support = uVar1 & 0x80;
  }
  pcVar2 = getenv("JSIMD_FORCENONE");
  if (((pcVar2 != (char *)0x0) && (*pcVar2 == '1')) && (pcVar2[1] == '\0')) {
    simd_support = 0;
  }
  pcVar2 = getenv("JSIMD_NOHUFFENC");
  if (((pcVar2 != (char *)0x0) && (*pcVar2 == '1')) && (pcVar2[1] == '\0')) {
    simd_huffman = 1;
  }
  return;
}

Assistant:

LOCAL(void)
init_simd(void)
{
#ifndef NO_GETENV
  char *env = NULL;
#endif

  if (simd_support != ~0U)
    return;

  simd_support = jpeg_simd_cpu_support();

#ifndef NO_GETENV
  /* Force different settings through environment variables */
  env = getenv("JSIMD_FORCESSE2");
  if ((env != NULL) && (strcmp(env, "1") == 0))
    simd_support &= JSIMD_SSE2;
  env = getenv("JSIMD_FORCEAVX2");
  if ((env != NULL) && (strcmp(env, "1") == 0))
    simd_support &= JSIMD_AVX2;
  env = getenv("JSIMD_FORCENONE");
  if ((env != NULL) && (strcmp(env, "1") == 0))
    simd_support = 0;
  env = getenv("JSIMD_NOHUFFENC");
  if ((env != NULL) && (strcmp(env, "1") == 0))
    simd_huffman = 0;
#endif
}